

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O3

void __thiscall ScriptElement_CopyOperator_Test::TestBody(ScriptElement_CopyOperator_Test *this)

{
  bool bVar1;
  ScriptElementType SVar2;
  ScriptOperator *lhs;
  ScriptOperator *rhs;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_2;
  ScriptElement copied_elem;
  ScriptElement op_elem;
  undefined1 local_148 [32];
  string local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  internal local_f0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  ByteData local_e0;
  ScriptElement local_c8;
  ScriptElement local_68;
  
  cfd::core::ScriptElement::ScriptElement
            (&local_68,(ScriptOperator *)cfd::core::ScriptOperator::OP_NOP);
  cfd::core::ScriptElement::ScriptElement(&local_c8,&local_68);
  local_148._0_4_ = cfd::core::ScriptElement::GetType(&local_68);
  SVar2 = cfd::core::ScriptElement::GetType(&local_c8);
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,SVar2);
  testing::internal::CmpHelperEQ<cfd::core::ScriptElementType,cfd::core::ScriptElementType>
            ((internal *)&local_128,"op_elem.GetType()","copied_elem.GetType()",
             (ScriptElementType *)local_148,(ScriptElementType *)&local_108);
  if ((char)local_128._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_148);
    if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_128._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_148._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_128._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lhs = cfd::core::ScriptElement::GetOpCode(&local_68);
  rhs = cfd::core::ScriptElement::GetOpCode(&local_c8);
  testing::internal::CmpHelperEQ<cfd::core::ScriptOperator,cfd::core::ScriptOperator>
            ((internal *)&local_128,"op_elem.GetOpCode()","copied_elem.GetOpCode()",lhs,rhs);
  if ((char)local_128._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_148);
    if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_128._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_148._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_128._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptElement::GetBinaryData((ByteData *)local_148,&local_68);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)local_148);
  cfd::core::ScriptElement::GetBinaryData(&local_e0,&local_c8);
  cfd::core::ByteData::GetBytes(&local_108,&local_e0);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (local_f0,"op_elem.GetBinaryData().GetBytes()","copied_elem.GetBinaryData().GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,&local_108);
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                     (char)local_128._M_dataplus._M_p));
  }
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_148._0_8_);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if (CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                       (char)local_128._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_148._0_8_ = cfd::core::ScriptElement::GetNumber(&local_68);
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cfd::core::ScriptElement::GetNumber(&local_c8);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_128,"op_elem.GetNumber()","copied_elem.GetNumber()",
             (long *)local_148,(long *)&local_108);
  if ((char)local_128._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_148);
    if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_128._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_148._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_128._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptElement::GetData((ByteData *)local_148,&local_68);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (ByteData *)local_148);
  cfd::core::ScriptElement::GetData(&local_e0,&local_c8);
  cfd::core::ByteData::GetBytes(&local_108,&local_e0);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (local_f0,"op_elem.GetData().GetBytes()","copied_elem.GetData().GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,&local_108);
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                     (char)local_128._M_dataplus._M_p));
  }
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_148._0_8_);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if (CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                       (char)local_128._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptElement::ToString_abi_cxx11_(&local_128,&local_68);
  pcVar3 = (char *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p);
  cfd::core::ScriptElement::ToString_abi_cxx11_((string *)local_148,&local_c8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_108,"op_elem.ToString().c_str()","copied_elem.ToString().c_str()",
             pcVar3,(char *)local_148._0_8_);
  if ((AssertHelperData *)local_148._0_8_ != (AssertHelperData *)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
      &local_128.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p));
  }
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if (CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_128._M_dataplus._M_p._1_7_,(char)local_128._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_128._M_dataplus._M_p._1_7_,
                                       (char)local_128._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptElement::~ScriptElement(&local_c8);
  cfd::core::ScriptElement::~ScriptElement(&local_68);
  return;
}

Assistant:

TEST(ScriptElement, CopyOperator) {
  ScriptElement op_elem = ScriptElement(ScriptOperator::OP_NOP);
  ScriptElement copied_elem = op_elem;

  EXPECT_EQ(op_elem.GetType(), copied_elem.GetType());
  EXPECT_EQ(op_elem.GetOpCode(), copied_elem.GetOpCode());
  EXPECT_EQ(op_elem.GetBinaryData().GetBytes(),
            copied_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(op_elem.GetNumber(), copied_elem.GetNumber());
  EXPECT_EQ(op_elem.GetData().GetBytes(), copied_elem.GetData().GetBytes());
  EXPECT_STREQ(op_elem.ToString().c_str(), copied_elem.ToString().c_str());
}